

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::
CordOutputStreamTest_CapsSizeAtHintButUsesCapacityBeyondHint_Test::TestBody
          (CordOutputStreamTest_CapsSizeAtHintButUsesCapacityBeyondHint_Test *this)

{
  bool bVar1;
  _Alloc_hider __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  int size;
  string_view fragment;
  Cord cord;
  void *data;
  size_t size_hint;
  CordOutputStream output;
  int local_15c;
  undefined1 local_158 [8];
  AssertHelperData *pAStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  string local_120;
  AssertHelper local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  AssertHelperData *local_98;
  void *local_90;
  anon_union_16_2_b9f6da03_for_Rep_1 local_88;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  CordOutputStream local_50;
  
  local_88.long_rep.rep = (CordRepFlat *)&DAT_00000011;
  CordOutputStream::CordOutputStream(&local_50,0x11);
  bVar1 = CordOutputStream::Next(&local_50,&local_90,&local_15c);
  local_e0[0] = bVar1;
  local_d8._M_p = (pointer)0x0;
  if (bVar1) {
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_158,"size","size_hint",&local_15c,(unsigned_long *)&local_88);
    if (local_158[0] != (internal)0x0) {
      if (pAStack_150 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pAStack_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pAStack_150);
      }
      memset(local_90,0x61,(long)local_15c);
      bVar1 = CordOutputStream::Next(&local_50,&local_90,&local_15c);
      local_e0[0] = bVar1;
      local_d8._M_p = (pointer)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_158,(internal *)local_e0,
                   (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x511,(char *)local_158);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_120);
        goto LAB_00b4309a;
      }
      memset(local_90,0x62,(long)local_15c);
      CordOutputStream::Consume((CordOutputStream *)local_b0);
      if ((Nonnull<CordRep_*>)local_a8._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_b0[0] & 1) == 0) {
LAB_00b43000:
        if ((Nonnull<CordRep_*>)local_a8._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_b0[0] & 1) == 0)
        {
          if ((local_b0[0] & 1) == 0) {
            local_70.field_2._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((ulong)(long)(char)local_b0[0] >> 1);
            local_70.field_2._8_8_ = (AssertHelperData *)(local_b0 + 1);
          }
          else {
            local_70.field_2._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((Nonnull<CordRep_*>)local_a8._0_8_)->length;
            local_70.field_2._8_8_ = (AssertHelperData *)0x0;
          }
        }
        else {
          local_158 = (undefined1  [8])0x0;
          pAStack_150 = (AssertHelperData *)0x0;
          absl::lts_20250127::Cord::GetFlatAux
                    ((Nonnull<CordRep_*>)local_a8._0_8_,(Nonnull<absl::string_view_*>)local_158);
          local_70.field_2._M_allocated_capacity = (size_type)local_158;
          local_70.field_2._8_8_ = pAStack_150;
        }
        local_100.data_ = (AssertHelperData *)local_f0;
        std::__cxx11::string::_M_construct((ulong)&local_100,(char)local_88.long_rep.rep);
        local_158 = (undefined1  [8])local_f8;
        pAStack_150 = local_100.data_;
        local_88.long_rep.padding = &local_70;
        std::__cxx11::string::_M_construct((long)&local_88 + 8,(char)local_15c);
        local_e0 = (undefined1  [8])
                   local_78._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
        local_d8._M_p = (pointer)local_88.long_rep.padding;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_120,(lts_20250127 *)local_158,(AlphaNum *)local_e0,
                   (AlphaNum *)
                   local_78._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
        testing::internal::
        CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  ((internal *)(local_a8 + 8),"flat",
                   "absl::StrCat(std::string(size_hint, \'a\'), std::string(static_cast<size_t>(size), \'b\'))"
                   ,(basic_string_view<char,_std::char_traits<char>_> *)&local_70.field_2,&local_120
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_88.long_rep.padding != &local_70) {
          operator_delete(local_88.long_rep.padding,(ulong)(local_70._M_dataplus._M_p + 1));
        }
        if (local_100.data_ != (AssertHelperData *)local_f0) {
          operator_delete(local_100.data_,local_f0._0_8_ + 1);
        }
        if (local_a8[8] == '\0') {
          testing::Message::Message((Message *)local_158);
          if (local_98 == (AssertHelperData *)0x0) {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = *(char **)local_98;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                     ,0x519,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
          if (local_158 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_158 + 8))();
          }
        }
        if (local_98 != (AssertHelperData *)0x0) {
          pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98;
LAB_00b43490:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98);
        }
      }
      else {
        local_158 = (undefined1  [8])0x0;
        pAStack_150 = (AssertHelperData *)0x0;
        bVar1 = absl::lts_20250127::Cord::GetFlatAux
                          ((Nonnull<CordRep_*>)local_a8._0_8_,
                           (Nonnull<absl::string_view_*>)local_158);
        if (bVar1) goto LAB_00b43000;
        local_e0 = (undefined1  [8])((ulong)local_e0 & 0xffffffffffffff00);
        local_d8._M_p = (pointer)0x0;
        testing::Message::Message((Message *)&local_120);
        pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_158,(internal *)local_e0,(AssertionResult *)"cord.TryFlat()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x516,(char *)local_158);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (local_158 != (undefined1  [8])local_148) {
          operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
        }
        if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
        }
        local_98 = (AssertHelperData *)local_d8._M_p;
        if ((AssertHelperData *)local_d8._M_p != (AssertHelperData *)0x0) goto LAB_00b43490;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)local_b0);
      goto LAB_00b431d6;
    }
    testing::Message::Message((Message *)local_e0);
    if (pAStack_150 == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = *(char **)pAStack_150;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x50e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (pAStack_150 == (AssertHelperData *)0x0) goto LAB_00b431d6;
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pAStack_150;
    __ptr_00._M_p = (pointer)pAStack_150;
  }
  else {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_e0,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x50d,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_120);
LAB_00b4309a:
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_d8;
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
    __ptr_00._M_p = local_d8._M_p;
    if ((AssertHelperData *)local_d8._M_p == (AssertHelperData *)0x0) goto LAB_00b431d6;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __ptr_00._M_p);
LAB_00b431d6:
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  return;
}

Assistant:

TEST(CordOutputStreamTest, CapsSizeAtHintButUsesCapacityBeyondHint) {
  // This tests verifies that when we provide a hint of 'x' bytes, that the
  // returned size from Next() will be capped at 'size_hint', but that if we
  // exceed size_hint, it will use the capacity in any internal buffer beyond
  // the size hint. We test this by providing a hint that is too large to be
  // inlined, but so small that we have a guarantee it's smaller than the
  // minimum flat size so we will have a 'capped' larger buffer as state.
  size_t size_hint = sizeof(absl::Cord) + 1;
  CordOutputStream output(size_hint);
  void* data;
  int size;

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, size_hint);
  memset(data, 'a', static_cast<size_t>(size));

  ASSERT_TRUE(output.Next(&data, &size));
  memset(data, 'b', static_cast<size_t>(size));

  // We should have received the same buffer on each Next() call
  absl::Cord cord = output.Consume();
  ASSERT_TRUE(cord.TryFlat());
  absl::string_view flat = *cord.TryFlat();
  EXPECT_EQ(flat, absl::StrCat(std::string(size_hint, 'a'),
                               std::string(static_cast<size_t>(size), 'b')));
}